

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O2

const_iterator __thiscall
mapbox::eternal::impl::
map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
::find(map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
       *this,key_type *key)

{
  element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *right;
  bool bVar1;
  element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *rhs;
  compare_key_type compare_key;
  compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_> cStack_28;
  
  compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_>::compare_key_hash
            (&cStack_28,key);
  right = this[1].data_;
  rhs = bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element_hash<mapbox::eternal::string,unsigned_int,std::hash<mapbox::eternal::string>>const*,mapbox::eternal::impl::compare_key_hash<mapbox::eternal::string,std::hash<mapbox::eternal::string>>>
                  (this->data_,right,&cStack_28);
  if ((rhs != right) &&
     (bVar1 = compare_key_hash<mapbox::eternal::string,std::hash<mapbox::eternal::string>>::
              operator<((compare_key_hash<mapbox::eternal::string,std::hash<mapbox::eternal::string>>
                         *)&cStack_28,rhs), !bVar1)) {
    return (const_iterator)rhs;
  }
  return (const_iterator)right;
}

Assistant:

find(const key_type& key) const noexcept {
        const compare_key_type compare_key{ key };
        auto it = bound<less>(data_, data_ + N, compare_key);
        if (it != data_ + N && greater_equal()(*it, compare_key)) {
            return it;
        } else {
            return end();
        }
    }